

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O2

void __thiscall
bench::save_stats(bench *this,ostream *os,string *name,
                 vector<bench::element,_std::allocator<bench::element>_> *c)

{
  size_t *psVar1;
  undefined1 auVar2 [16];
  pointer pmVar3;
  pointer pmVar4;
  pointer pdVar5;
  pointer pmVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  size_t sVar9;
  long lVar10;
  long lVar11;
  size_t *psVar12;
  size_t in_R8;
  size_t sVar13;
  pointer in_R9;
  long lVar14;
  long lVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 in_XMM2 [16];
  vector<result,_std::allocator<result>_> line;
  vector<result,_std::allocator<result>_> stats;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,name);
  save_header(this,os,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::vector<result,_std::allocator<result>_>::vector
            (&stats,((long)(this->solvers).
                           super__Vector_base<bench::solver,_std::allocator<bench::solver>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)(this->solvers).
                           super__Vector_base<bench::solver,_std::allocator<bench::solver>_>._M_impl
                           .super__Vector_impl_data._M_start >> 5) + 1,(allocator_type *)&line);
  std::vector<result,_std::allocator<result>_>::vector
            (&line,((long)(this->solvers).
                          super__Vector_base<bench::solver,_std::allocator<bench::solver>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(this->solvers).
                          super__Vector_base<bench::solver,_std::allocator<bench::solver>_>._M_impl.
                          super__Vector_impl_data._M_start >> 5) + 1,(allocator_type *)&local_60);
  pmVar3 = (this->models).super__Vector_base<bench::model,_std::allocator<bench::model>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pmVar4 = (this->models).super__Vector_base<bench::model,_std::allocator<bench::model>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar15 = 0;
  for (lVar11 = 0; lVar11 != ((long)pmVar3 - (long)pmVar4) / 0x28; lVar11 = lVar11 + 1) {
    pdVar5 = (this->array).m_data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    psVar12 = &(line.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                super__Vector_impl_data._M_start)->rank;
    for (sVar13 = 0;
        ((long)line.super__Vector_base<result,_std::allocator<result>_>._M_impl.
               super__Vector_impl_data._M_finish -
        (long)line.super__Vector_base<result,_std::allocator<result>_>._M_impl.
              super__Vector_impl_data._M_start) / 0x18 != sVar13; sVar13 = sVar13 + 1) {
      in_R9 = (pointer)((this->array).m_line_size * lVar15 + (long)pdVar5);
      ((result *)(psVar12 + -2))->value = in_R9[sVar13];
      psVar12[-1] = sVar13;
      *psVar12 = 0;
      psVar12 = psVar12 + 3;
    }
    sVar13 = (long)(this->solvers).super__Vector_base<bench::solver,_std::allocator<bench::solver>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->solvers).super__Vector_base<bench::solver,_std::allocator<bench::solver>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
    line.super__Vector_base<result,_std::allocator<result>_>._M_impl.super__Vector_impl_data.
    _M_start[sVar13].value =
         (c->super__Vector_base<bench::element,_std::allocator<bench::element>_>)._M_impl.
         super__Vector_impl_data._M_start[lVar11].solution;
    line.super__Vector_base<result,_std::allocator<result>_>._M_impl.super__Vector_impl_data.
    _M_start[sVar13].position = sVar13;
    line.super__Vector_base<result,_std::allocator<result>_>._M_impl.super__Vector_impl_data.
    _M_start[sVar13].rank = 0;
    sort_on_value<__gnu_cxx::__normal_iterator<result*,std::vector<result,std::allocator<result>>>>
              ((__normal_iterator<result_*,_std::vector<result,_std::allocator<result>_>_>)
               line.super__Vector_base<result,_std::allocator<result>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<result_*,_std::vector<result,_std::allocator<result>_>_>)
               line.super__Vector_base<result,_std::allocator<result>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (this->models).super__Vector_base<bench::model,_std::allocator<bench::model>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar11].m_objective_type);
    (line.super__Vector_base<result,_std::allocator<result>_>._M_impl.super__Vector_impl_data.
    _M_start)->rank = 1;
    psVar12 = &line.super__Vector_base<result,_std::allocator<result>_>._M_impl.
               super__Vector_impl_data._M_start[1].rank;
    sVar9 = ((long)line.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)line.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                  super__Vector_impl_data._M_start) / 0x18;
    sVar13 = 1;
    in_R8 = sVar13;
    while (sVar9 != sVar13) {
      auVar17._8_8_ = 0;
      auVar17._0_8_ = ((result *)(psVar12 + -2))->value;
      sVar13 = sVar13 + 1;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = psVar12[-5];
      uVar7 = vcmpsd_avx512f(auVar17,auVar2,4);
      in_R9 = (pointer)CONCAT44((int)((ulong)in_R9 >> 0x20),(uint)((ushort)uVar7 & 1));
      in_R8 = in_R8 + (long)in_R9;
      *psVar12 = in_R8;
      psVar12 = psVar12 + 3;
    }
    psVar12 = &(line.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                super__Vector_impl_data._M_start)->rank;
    while (bVar16 = sVar9 != 0, sVar9 = sVar9 - 1, bVar16) {
      psVar1 = psVar12 + -1;
      in_R9 = (pointer)(*psVar1 * 0x18);
      in_R8 = *psVar12;
      psVar12 = psVar12 + 3;
      stats.super__Vector_base<result,_std::allocator<result>_>._M_impl.super__Vector_impl_data.
      _M_start[*psVar1].rank =
           stats.super__Vector_base<result,_std::allocator<result>_>._M_impl.super__Vector_impl_data
           ._M_start[*psVar1].rank + in_R8;
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<result*,std::vector<result,std::allocator<result>>>,__gnu_cxx::__ops::_Iter_comp_iter<bench::save_stats(std::ostream&,std::__cxx11::string,std::vector<bench::element,std::allocator<bench::element>>const&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
              ();
    pmVar6 = (this->models).super__Vector_base<bench::model,_std::allocator<bench::model>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_60._M_str = pmVar6[lVar11].m_name._M_dataplus._M_p;
    local_60._M_len = pmVar6[lVar11].m_name._M_string_length;
    ::fmt::v7::print<char[3],std::basic_string_view<char,std::char_traits<char>>,char>
              (os,(char (*) [3])0x559864,&local_60);
    lVar10 = ((long)line.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)line.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x18;
    lVar14 = 0x10;
    while (bVar16 = lVar10 != 0, lVar10 = lVar10 + -1, bVar16) {
      ::fmt::v7::print<char[4],unsigned_long&,char>
                (os,(char (*) [4])",{}",
                 (unsigned_long *)
                 ((long)&(line.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                          super__Vector_impl_data._M_start)->value + lVar14));
      lVar14 = lVar14 + 0x18;
    }
    ::fmt::v7::print<char[2],,char>(os,(char (*) [2])0x556927);
    lVar15 = lVar15 + 8;
  }
  ::fmt::v7::print<char[5],,char>(os,(char (*) [5])0x555bb0);
  lVar15 = 0;
  for (lVar11 = 0;
      ((long)line.super__Vector_base<result,_std::allocator<result>_>._M_impl.
             super__Vector_impl_data._M_finish -
      (long)line.super__Vector_base<result,_std::allocator<result>_>._M_impl.super__Vector_impl_data
            ._M_start) / 0x18 != lVar11; lVar11 = lVar11 + 1) {
    auVar8 = vcvtusi2sd_avx512f(in_XMM2,*(undefined8 *)
                                         ((long)&(stats.
                                                  super__Vector_base<result,_std::allocator<result>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->rank +
                                         lVar15));
    auVar18 = vcvtusi2sd_avx512f(in_XMM2,((long)(this->models).
                                                super__Vector_base<bench::model,_std::allocator<bench::model>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(this->models).
                                               super__Vector_base<bench::model,_std::allocator<bench::model>_>
                                               ._M_impl.super__Vector_impl_data._M_start) / 0x28);
    *(double *)
     ((long)&(stats.super__Vector_base<result,_std::allocator<result>_>._M_impl.
              super__Vector_impl_data._M_start)->value + lVar15) = auVar8._0_8_ / auVar18._0_8_;
    *(long *)((long)&(stats.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                      super__Vector_impl_data._M_start)->position + lVar15) = lVar11;
    ::fmt::v7::print<char[4],double&,char>
              (os,(char (*) [4])",{}",
               (double *)
               ((long)&(stats.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                        super__Vector_impl_data._M_start)->value + lVar15));
    lVar15 = lVar15 + 0x18;
  }
  ::fmt::v7::print<char[2],,char>(os,(char (*) [2])0x556927);
  std::
  __sort<__gnu_cxx::__normal_iterator<result*,std::vector<result,std::allocator<result>>>,__gnu_cxx::__ops::_Iter_comp_iter<bench::save_stats(std::ostream&,std::__cxx11::string,std::vector<bench::element,std::allocator<bench::element>>const&)::_lambda(auto:1_const&,auto:2_const&)_2_>>
            (stats.super__Vector_base<result,_std::allocator<result>_>._M_impl.
             super__Vector_impl_data._M_start,
             stats.super__Vector_base<result,_std::allocator<result>_>._M_impl.
             super__Vector_impl_data._M_finish);
  (stats.super__Vector_base<result,_std::allocator<result>_>._M_impl.super__Vector_impl_data.
  _M_start)->rank = 1;
  psVar12 = &stats.super__Vector_base<result,_std::allocator<result>_>._M_impl.
             super__Vector_impl_data._M_start[1].rank;
  lVar11 = ((long)stats.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                  super__Vector_impl_data._M_finish -
           (long)stats.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                 super__Vector_impl_data._M_start) / 0x18;
  sVar13 = 1;
  while (lVar11 = lVar11 + -1, lVar11 != 0) {
    auVar18._8_8_ = 0;
    auVar18._0_8_ = ((result *)(psVar12 + -2))->value;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = psVar12[-5];
    uVar7 = vcmpsd_avx512f(auVar18,auVar8,4);
    in_R8 = CONCAT44((int)(in_R8 >> 0x20),(uint)((ushort)uVar7 & 1));
    sVar13 = sVar13 + in_R8;
    *psVar12 = sVar13;
    psVar12 = psVar12 + 3;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<result*,std::vector<result,std::allocator<result>>>,__gnu_cxx::__ops::_Iter_comp_iter<bench::save_stats(std::ostream&,std::__cxx11::string,std::vector<bench::element,std::allocator<bench::element>>const&)::_lambda(auto:1_const&,auto:2_const&)_3_>>
            ();
  ::fmt::v7::print<char[5],,char>(os,(char (*) [5])"rank");
  lVar15 = ((long)stats.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                  super__Vector_impl_data._M_finish -
           (long)stats.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                 super__Vector_impl_data._M_start) / 0x18;
  lVar11 = 0x10;
  while (bVar16 = lVar15 != 0, lVar15 = lVar15 + -1, bVar16) {
    ::fmt::v7::print<char[4],unsigned_long&,char>
              (os,(char (*) [4])",{}",
               (unsigned_long *)
               ((long)&(stats.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                        super__Vector_impl_data._M_start)->value + lVar11));
    lVar11 = lVar11 + 0x18;
  }
  ::fmt::v7::print<char[2],,char>(os,(char (*) [2])0x556927);
  std::_Vector_base<result,_std::allocator<result>_>::~_Vector_base
            (&line.super__Vector_base<result,_std::allocator<result>_>);
  std::_Vector_base<result,_std::allocator<result>_>::~_Vector_base
            (&stats.super__Vector_base<result,_std::allocator<result>_>);
  return;
}

Assistant:

void save_stats(std::ostream& os,
                    std::string name,
                    const std::vector<element>& c)
    {
        save_header(os, name);

        std::vector<result> stats(solvers.size() + 1);
        std::vector<result> line(solvers.size() + 1);

        for (size_t i{ 0 }, e{ models.size() }; i != e; ++i) {
            for (size_t j{ 0 }, end_j{ line.size() }; j != end_j; ++j)
                line[j] = { array(i, j), j };
            line[solvers.size()] = { c[i].solution, solvers.size() };

            sort_on_value(
              std::begin(line), std::end(line), models[i].objective_type());

            size_t rank = 1;
            line[0].rank = rank;

            // values: 7 7 9 10 11 11
            // ranks:  1 1 2  3  4  4
            // but maybe we want:
            // ranks:  1 1 3  4  5  5

            for (size_t j = { 1 }, end_j{ line.size() }; j != end_j; ++j) {
                if (line[j].value != line[j - 1].value)
                    ++rank;

                line[j].rank = rank;
            }

            for (size_t j{ 0 }, end_j{ line.size() }; j != end_j; ++j)
                stats[line[j].position].rank += line[j].rank;

            std::sort(std::begin(line),
                      std::end(line),
                      [](const auto& lhs, const auto& rhs) {
                          return lhs.position < rhs.position;
                      });

            fmt::print(os, "{}", models[i].name());
            for (size_t j{ 0 }, end_j{ line.size() }; j != end_j; ++j)
                fmt::print(os, ",{}", line[j].rank);
            fmt::print(os, "\n");
        }

        fmt::print(os, "mean");
        for (size_t j{ 0 }, end_j{ line.size() }; j != end_j; ++j) {
            stats[j].value = static_cast<double>(stats[j].rank) /
                             static_cast<double>(models.size());
            stats[j].position = j;

            fmt::print(os, ",{}", stats[j].value);
        }
        fmt::print(os, "\n");

        std::sort(std::begin(stats),
                  std::end(stats),
                  [](const auto& lhs, const auto& rhs) {
                      return lhs.value < rhs.value;
                  });

        size_t rank = 1;
        stats[0].rank = rank;

        for (size_t i{ 1 }, e = stats.size(); i != e; ++i) {
            if (stats[i].value != stats[i - 1].value)
                ++rank;

            stats[i].rank = rank;
        }

        std::sort(std::begin(stats),
                  std::end(stats),
                  [](const auto& lhs, const auto& rhs) {
                      return lhs.position < rhs.position;
                  });

        fmt::print(os, "rank");
        for (size_t i{ 0 }, e = stats.size(); i != e; ++i)
            fmt::print(os, ",{}", stats[i].rank);
        fmt::print(os, "\n");
    }